

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_uv.cc
# Opt level: O0

void libyuv::ScaleUVDown2
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_uv,uint8_t *dst_uv,int x,int dx,int y,int dy,
               FilterMode filtering)

{
  int in_ECX;
  int iVar1;
  uint in_EDX;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  _func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_int *ScaleUVRowDown2;
  int row_stride;
  int j;
  int in_stack_00000038;
  code *local_38;
  code *local_28;
  int local_1c;
  int local_14;
  
  if (in_stack_00000038 == 0) {
    local_38 = ScaleUVRowDown2_C;
  }
  else if (in_stack_00000038 == 1) {
    local_38 = ScaleUVRowDown2Linear_C;
  }
  else {
    local_38 = ScaleUVRowDown2Box_C;
  }
  if (in_stack_00000038 == 2) {
    iVar1 = (dst_height >> 0x10) * in_R8D + (row_stride >> 0x10) * 2;
  }
  else {
    iVar1 = (dst_height >> 0x10) * in_R8D + ((row_stride >> 0x10) + -1) * 2;
  }
  in_stack_00000008 = in_stack_00000008 + iVar1;
  iVar1 = TestCpuFlag(0);
  local_28 = local_38;
  if (((iVar1 != 0) && (in_stack_00000038 != 0)) &&
     (local_28 = ScaleUVRowDown2Box_Any_SSSE3, (in_EDX & 3) == 0)) {
    local_28 = ScaleUVRowDown2Box_SSSE3;
  }
  iVar1 = TestCpuFlag(0);
  if (((iVar1 != 0) && (in_stack_00000038 != 0)) &&
     (local_28 = ScaleUVRowDown2Box_Any_AVX2, (in_EDX & 7) == 0)) {
    local_28 = ScaleUVRowDown2Box_AVX2;
  }
  local_14 = in_R8D;
  if (in_stack_00000038 == 1) {
    local_14 = 0;
  }
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    (*local_28)(in_stack_00000008,(long)local_14,ScaleUVRowDown2,in_EDX);
    in_stack_00000008 = in_stack_00000008 + in_R8D * (src_height >> 0x10);
    ScaleUVRowDown2 = ScaleUVRowDown2 + in_R9D;
  }
  return;
}

Assistant:

static void ScaleUVDown2(int src_width,
                         int src_height,
                         int dst_width,
                         int dst_height,
                         int src_stride,
                         int dst_stride,
                         const uint8_t* src_uv,
                         uint8_t* dst_uv,
                         int x,
                         int dx,
                         int y,
                         int dy,
                         enum FilterMode filtering) {
  int j;
  int row_stride = src_stride * (dy >> 16);
  void (*ScaleUVRowDown2)(const uint8_t* src_uv, ptrdiff_t src_stride,
                          uint8_t* dst_uv, int dst_width) =
      filtering == kFilterNone
          ? ScaleUVRowDown2_C
          : (filtering == kFilterLinear ? ScaleUVRowDown2Linear_C
                                        : ScaleUVRowDown2Box_C);
  (void)src_width;
  (void)src_height;
  (void)dx;
  assert(dx == 65536 * 2);      // Test scale factor of 2.
  assert((dy & 0x1ffff) == 0);  // Test vertical scale is multiple of 2.
  // Advance to odd row, even column.
  if (filtering == kFilterBilinear) {
    src_uv += (y >> 16) * src_stride + (x >> 16) * 2;
  } else {
    src_uv += (y >> 16) * src_stride + ((x >> 16) - 1) * 2;
  }

#if defined(HAS_SCALEUVROWDOWN2BOX_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && filtering) {
    ScaleUVRowDown2 = ScaleUVRowDown2Box_Any_SSSE3;
    if (IS_ALIGNED(dst_width, 4)) {
      ScaleUVRowDown2 = ScaleUVRowDown2Box_SSSE3;
    }
  }
#endif
#if defined(HAS_SCALEUVROWDOWN2BOX_AVX2)
  if (TestCpuFlag(kCpuHasAVX2) && filtering) {
    ScaleUVRowDown2 = ScaleUVRowDown2Box_Any_AVX2;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleUVRowDown2 = ScaleUVRowDown2Box_AVX2;
    }
  }
#endif
#if defined(HAS_SCALEUVROWDOWN2BOX_NEON)
  if (TestCpuFlag(kCpuHasNEON) && filtering) {
    ScaleUVRowDown2 = ScaleUVRowDown2Box_Any_NEON;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleUVRowDown2 = ScaleUVRowDown2Box_NEON;
    }
  }
#endif

// This code is not enabled.  Only box filter is available at this time.
#if defined(HAS_SCALEUVROWDOWN2_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ScaleUVRowDown2 =
        filtering == kFilterNone
            ? ScaleUVRowDown2_Any_SSSE3
            : (filtering == kFilterLinear ? ScaleUVRowDown2Linear_Any_SSSE3
                                          : ScaleUVRowDown2Box_Any_SSSE3);
    if (IS_ALIGNED(dst_width, 2)) {
      ScaleUVRowDown2 =
          filtering == kFilterNone
              ? ScaleUVRowDown2_SSSE3
              : (filtering == kFilterLinear ? ScaleUVRowDown2Linear_SSSE3
                                            : ScaleUVRowDown2Box_SSSE3);
    }
  }
#endif
// This code is not enabled.  Only box filter is available at this time.
#if defined(HAS_SCALEUVROWDOWN2_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ScaleUVRowDown2 =
        filtering == kFilterNone
            ? ScaleUVRowDown2_Any_NEON
            : (filtering == kFilterLinear ? ScaleUVRowDown2Linear_Any_NEON
                                          : ScaleUVRowDown2Box_Any_NEON);
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleUVRowDown2 =
          filtering == kFilterNone
              ? ScaleUVRowDown2_NEON
              : (filtering == kFilterLinear ? ScaleUVRowDown2Linear_NEON
                                            : ScaleUVRowDown2Box_NEON);
    }
  }
#endif
#if defined(HAS_SCALEUVROWDOWN2_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ScaleUVRowDown2 =
        filtering == kFilterNone
            ? ScaleUVRowDown2_Any_MMI
            : (filtering == kFilterLinear ? ScaleUVRowDown2Linear_Any_MMI
                                          : ScaleUVRowDown2Box_Any_MMI);
    if (IS_ALIGNED(dst_width, 2)) {
      ScaleUVRowDown2 =
          filtering == kFilterNone
              ? ScaleUVRowDown2_MMI
              : (filtering == kFilterLinear ? ScaleUVRowDown2Linear_MMI
                                            : ScaleUVRowDown2Box_MMI);
    }
  }
#endif
#if defined(HAS_SCALEUVROWDOWN2_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ScaleUVRowDown2 =
        filtering == kFilterNone
            ? ScaleUVRowDown2_Any_MSA
            : (filtering == kFilterLinear ? ScaleUVRowDown2Linear_Any_MSA
                                          : ScaleUVRowDown2Box_Any_MSA);
    if (IS_ALIGNED(dst_width, 2)) {
      ScaleUVRowDown2 =
          filtering == kFilterNone
              ? ScaleUVRowDown2_MSA
              : (filtering == kFilterLinear ? ScaleUVRowDown2Linear_MSA
                                            : ScaleUVRowDown2Box_MSA);
    }
  }
#endif

  if (filtering == kFilterLinear) {
    src_stride = 0;
  }
  for (j = 0; j < dst_height; ++j) {
    ScaleUVRowDown2(src_uv, src_stride, dst_uv, dst_width);
    src_uv += row_stride;
    dst_uv += dst_stride;
  }
}